

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O3

void __thiscall Catch::Matchers::HasSizeMatcher::~HasSizeMatcher(HasSizeMatcher *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_MatcherGenericBase).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_001b9808;
  pcVar2 = (this->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString._M_dataplus.
           _M_p;
  paVar1 = &(this->super_MatcherGenericBase).super_MatcherUntypedBase.m_cachedToString.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit HasSizeMatcher(std::size_t target_size):
                m_target_size(target_size)
            {}